

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

void artifact_exists(obj *otmp,char *name,boolean mod)

{
  int iVar1;
  int local_30;
  artifact *paStack_28;
  int m;
  artifact *a;
  boolean mod_local;
  char *name_local;
  obj *otmp_local;
  
  if ((otmp != (obj *)0x0) && (*name != '\0')) {
    for (paStack_28 = artilist + 1; paStack_28->otyp != 0; paStack_28 = paStack_28 + 1) {
      if ((paStack_28->otyp == otmp->otyp) && (iVar1 = strcmp(paStack_28->name,name), iVar1 == 0)) {
        iVar1 = (int)((long)paStack_28 - (long)artilist >> 6);
        if (mod == '\0') {
          local_30 = 0;
        }
        else {
          strip_oprops(otmp);
          local_30 = iVar1;
        }
        otmp->oartifact = (char)local_30;
        otmp->age = 0;
        if (otmp->otyp == 0xa4) {
          otmp->spe = '\0';
        }
        artiexist[iVar1] = mod;
        return;
      }
    }
  }
  return;
}

Assistant:

void artifact_exists(struct obj *otmp, const char *name, boolean mod)
{
	const struct artifact *a;

	if (otmp && *name)
	    for (a = artilist+1; a->otyp; a++)
		if (a->otyp == otmp->otyp && !strcmp(a->name, name)) {
		    int m = a - artilist;
		    if (mod) /* artifacts can't have properties */
			strip_oprops(otmp);
		    otmp->oartifact = (char)(mod ? m : 0);
		    otmp->age = 0;
		    if (otmp->otyp == RIN_INCREASE_DAMAGE)
			otmp->spe = 0;
		    artiexist[m] = mod;
		    break;
		}
	return;
}